

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgrdma.c
# Opt level: O0

unsigned_long get_next_value(void)

{
  int iVar1;
  unsigned_long local_10;
  unsigned_long value;
  
  iVar1 = get_next_word(&local_10);
  if (iVar1 != 0) {
    fprintf(_stderr,"unexpected end of file!\n");
    exit(1);
  }
  if (echo_data != 0) {
    printf("# 0x%08lx\n",local_10);
  }
  return local_10;
}

Assistant:

static unsigned long get_next_value(void)
{
	unsigned long value;

	if (get_next_word(&value)) {
		fprintf(stderr, "unexpected end of file!\n");
		exit(1);
	}

	if (echo_data)
		printf("# 0x%08lx\n", value);

	return value;
}